

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O2

bool btGeneric6DofSpring2Constraint::matrixToEulerYZX(btMatrix3x3 *mat,btVector3 *xyz)

{
  bool bVar1;
  float fVar2;
  btScalar bVar3;
  
  fVar2 = mat->m_el[0].m_floats[1];
  if (1.0 <= fVar2) {
    xyz->m_floats[0] = 0.0;
    fVar2 = atan2f(mat->m_el[1].m_floats[2],mat->m_el[2].m_floats[2]);
    xyz->m_floats[1] = fVar2;
    bVar3 = 1.5707964;
  }
  else {
    if (-1.0 < fVar2) {
      fVar2 = atan2f(-mat->m_el[2].m_floats[1],mat->m_el[1].m_floats[1]);
      xyz->m_floats[0] = fVar2;
      fVar2 = atan2f(-mat->m_el[0].m_floats[2],mat->m_el[0].m_floats[0]);
      xyz->m_floats[1] = fVar2;
      bVar3 = btAsin(mat->m_el[0].m_floats[1]);
      bVar1 = true;
      goto LAB_00171c91;
    }
    xyz->m_floats[0] = 0.0;
    fVar2 = atan2f(mat->m_el[1].m_floats[2],mat->m_el[2].m_floats[2]);
    xyz->m_floats[1] = -fVar2;
    bVar3 = -1.5707964;
  }
  bVar1 = false;
LAB_00171c91:
  xyz->m_floats[2] = bVar3;
  return bVar1;
}

Assistant:

bool btGeneric6DofSpring2Constraint::matrixToEulerYZX(const btMatrix3x3& mat,btVector3& xyz)
{
	// rot =  cy*cz   sy*sx-cy*cx*sz   cx*sy+cy*sz*sx
	//        sz           cz*cx           -cz*sx
	//        -cz*sy  cy*sx+cx*sy*sz   cy*cx-sy*sz*sx

	btScalar fi = btGetMatrixElem(mat,3);
	if (fi < btScalar(1.0f))
	{
		if (fi > btScalar(-1.0f))
		{
			xyz[0] = btAtan2(-btGetMatrixElem(mat,5),btGetMatrixElem(mat,4));
			xyz[1] = btAtan2(-btGetMatrixElem(mat,6),btGetMatrixElem(mat,0));
			xyz[2] = btAsin(btGetMatrixElem(mat,3));
			return true;
		}
		else
		{
			xyz[0] = btScalar(0.0);
			xyz[1] = -btAtan2(btGetMatrixElem(mat,7),btGetMatrixElem(mat,8));
			xyz[2] = -SIMD_HALF_PI;
			return false;
		}
	}
	else
	{
		xyz[0] = btScalar(0.0);
		xyz[1] = btAtan2(btGetMatrixElem(mat,7),btGetMatrixElem(mat,8));
		xyz[2] = SIMD_HALF_PI;
	}
	return false;
}